

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O3

bool __thiscall CDBWrapper::IsEmpty(CDBWrapper *this)

{
  long lVar1;
  byte bVar2;
  CDBIterator *this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = NewIterator(this);
  (**(code **)(*(long *)(((this_00->m_impl_iter)._M_t.
                          super___uniq_ptr_impl<CDBIterator::IteratorImpl,_std::default_delete<CDBIterator::IteratorImpl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_CDBIterator::IteratorImpl_*,_std::default_delete<CDBIterator::IteratorImpl>_>
                          .super__Head_base<0UL,_CDBIterator::IteratorImpl_*,_false>._M_head_impl)->
                        iter)._M_t + 0x18))();
  bVar2 = (**(code **)(*(long *)(((this_00->m_impl_iter)._M_t.
                                  super___uniq_ptr_impl<CDBIterator::IteratorImpl,_std::default_delete<CDBIterator::IteratorImpl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_CDBIterator::IteratorImpl_*,_std::default_delete<CDBIterator::IteratorImpl>_>
                                  .super__Head_base<0UL,_CDBIterator::IteratorImpl_*,_false>.
                                 _M_head_impl)->iter)._M_t + 0x10))();
  CDBIterator::~CDBIterator(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(this_00,0x10);
    return (bool)(bVar2 ^ 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CDBWrapper::IsEmpty()
{
    std::unique_ptr<CDBIterator> it(NewIterator());
    it->SeekToFirst();
    return !(it->Valid());
}